

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O1

bool doubles_equal(double d1,double d2,double threshold)

{
  int iVar1;
  double dVar2;
  
  iVar1 = (*PlatformSpecificIsNan)(d1);
  if (((iVar1 == 0) && (iVar1 = (*PlatformSpecificIsNan)(d2), iVar1 == 0)) &&
     (iVar1 = (*PlatformSpecificIsNan)(threshold), iVar1 == 0)) {
    iVar1 = (*PlatformSpecificIsInf)(d1);
    if ((iVar1 != 0) && (iVar1 = (*PlatformSpecificIsInf)(d2), iVar1 != 0)) {
      return true;
    }
    dVar2 = (*PlatformSpecificFabs)(d1 - d2);
    return dVar2 <= threshold;
  }
  return false;
}

Assistant:

bool doubles_equal(double d1, double d2, double threshold)
{
    if (PlatformSpecificIsNan(d1) || PlatformSpecificIsNan(d2) || PlatformSpecificIsNan(threshold))
        return false;

    if (PlatformSpecificIsInf(d1) && PlatformSpecificIsInf(d2))
    {
        return true;
    }

    return PlatformSpecificFabs(d1 - d2) <= threshold;
}